

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initkbd.c
# Opt level: O2

void init_keyboard(int flg)

{
  int fd;
  
  fd = flg;
  set_kbd_iopointers();
  if (flg == 0) {
    keyboardtype(fd);
  }
  init_Xevent(currentdsp);
  return;
}

Assistant:

void init_keyboard(int flg) /* if 0 init else re-init */
{
  set_kbd_iopointers();
  /* if using a raw keyboard, LispKbdFd would be the result of opening /dev/kbd
   * and it would be added to LispReadFds to generate keyboard events
   */
  if (flg == 0) { keyboardtype(LispKbdFd); }

#if   XWINDOW
  init_Xevent(currentdsp);
#elif DOS
  if (flg == 0) { /* Install the handlers ONLY when we */
    /* init the kbd the init the kbd the */
    /* first time. */

    /* turn on kbd */
    make_kbd_instance(currentkbd);
    (currentkbd->device.enter)(currentkbd);

    /* turn on mouse */
    make_mouse_instance(currentmouse);
    (currentmouse->device.enter)(currentmouse, currentdsp);
  }
#endif /* XWINDOW DOS */
}